

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

MessageSizeCounts __thiscall capnp::_::StructReader::totalSize(StructReader *this)

{
  ushort uVar1;
  SegmentReader *this_00;
  WordCount64 amount;
  int iVar2;
  long lVar3;
  MessageSizeCounts MVar4;
  
  uVar1 = this->pointerCount;
  amount = (ulong)uVar1 + ((ulong)this->dataSize + 0x3f >> 6);
  iVar2 = 0;
  for (lVar3 = 0; this_00 = this->segment, (ulong)uVar1 * 8 != lVar3; lVar3 = lVar3 + 8) {
    MVar4 = WireHelpers::totalSize
                      (this_00,(WirePointer *)((long)&(this->pointers->offsetAndKind).value + lVar3)
                       ,this->nestingLimit);
    amount = amount + MVar4.wordCount;
    iVar2 = iVar2 + MVar4.capCount;
  }
  if (this_00 != (SegmentReader *)0x0) {
    SegmentReader::unread(this_00,amount);
  }
  MVar4.capCount = iVar2;
  MVar4.wordCount = amount;
  MVar4._12_4_ = 0;
  return MVar4;
}

Assistant:

MessageSizeCounts StructReader::totalSize() const {
  MessageSizeCounts result = {
    WireHelpers::roundBitsUpToWords(dataSize) + pointerCount * WORDS_PER_POINTER, 0 };

  for (auto i: kj::zeroTo(pointerCount)) {
    result += WireHelpers::totalSize(segment, pointers + i, nestingLimit);
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}